

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O0

void __thiscall
VL53L0X::writeRegisterMultiple(VL53L0X *this,uint8_t reg,uint8_t *source,uint8_t count)

{
  I2Cgeneric *pIVar1;
  uint uVar2;
  runtime_error *this_00;
  byte local_26;
  uint8_t local_25 [4];
  uint8_t local_21;
  bool p;
  uint8_t i;
  uint8_t data [4];
  uint8_t *puStack_20;
  uint8_t count_local;
  uint8_t *source_local;
  uint8_t reg_local;
  VL53L0X *this_local;
  
  for (local_26 = 0; local_26 < 4; local_26 = local_26 + 1) {
    local_25[local_26] = source[local_26];
  }
  pIVar1 = (this->super_VL53LXX).i2c;
  local_21 = count;
  puStack_20 = source;
  uVar2 = (*pIVar1->_vptr_I2Cgeneric[0x1a])(pIVar1,(ulong)reg,(ulong)count,local_25);
  if ((uVar2 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Error writing block to register");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void VL53L0X::writeRegisterMultiple(uint8_t reg, const uint8_t* source, uint8_t count) {
	uint8_t data[4];
	for (uint8_t i = 0; i < 4; ++i) {
		data[i] = source[i];
	}
	bool p = this->i2c->writeBytes(reg, count, data);
	if (!p) {
		throw(std::runtime_error("Error writing block to register"));
	}
}